

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktBasicDrawTests.cpp
# Opt level: O3

void __thiscall
vkt::Draw::anon_unknown_0::DrawIndexedIndirectParams::addCommand
          (DrawIndexedIndirectParams *this,deUint32 indexC,deUint32 instanceC,deUint32 firstIdx,
          deInt32 vertexO,deUint32 firstIns)

{
  pointer *ppVVar1;
  iterator __position;
  VkDrawIndexedIndirectCommand cmd;
  VkDrawIndexedIndirectCommand local_14;
  
  local_14.instanceCount = 1;
  local_14.firstInstance = 0;
  __position._M_current =
       (this->commands).
       super__Vector_base<vk::VkDrawIndexedIndirectCommand,_std::allocator<vk::VkDrawIndexedIndirectCommand>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->commands).
      super__Vector_base<vk::VkDrawIndexedIndirectCommand,_std::allocator<vk::VkDrawIndexedIndirectCommand>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    local_14.indexCount = indexC;
    local_14.firstIndex = instanceC;
    local_14.vertexOffset = firstIdx;
    std::vector<vk::VkDrawIndexedIndirectCommand,std::allocator<vk::VkDrawIndexedIndirectCommand>>::
    _M_realloc_insert<vk::VkDrawIndexedIndirectCommand_const&>
              ((vector<vk::VkDrawIndexedIndirectCommand,std::allocator<vk::VkDrawIndexedIndirectCommand>>
                *)&this->commands,__position,&local_14);
  }
  else {
    (__position._M_current)->firstInstance = 0;
    (__position._M_current)->indexCount = indexC;
    (__position._M_current)->instanceCount = 1;
    (__position._M_current)->firstIndex = instanceC;
    (__position._M_current)->vertexOffset = firstIdx;
    ppVVar1 = &(this->commands).
               super__Vector_base<vk::VkDrawIndexedIndirectCommand,_std::allocator<vk::VkDrawIndexedIndirectCommand>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    *ppVVar1 = *ppVVar1 + 1;
  }
  return;
}

Assistant:

void addCommand (const deUint32 indexC, const deUint32 instanceC, const deUint32 firstIdx, const deInt32 vertexO, const deUint32 firstIns)
	{
		vk::VkDrawIndexedIndirectCommand	cmd;
		cmd.indexCount						= indexC;
		cmd.instanceCount					= instanceC;
		cmd.firstIndex						= firstIdx;
		cmd.vertexOffset					= vertexO;
		cmd.firstInstance					= firstIns;

		commands.push_back(cmd);
	}